

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_skip(gz_statep state,long len)

{
  int iVar1;
  uint local_28;
  long lStack_20;
  uint n;
  long len_local;
  gz_statep state_local;
  
  lStack_20 = len;
  while( true ) {
    while( true ) {
      if (lStack_20 == 0) {
        return 0;
      }
      if (state->have == 0) break;
      if (lStack_20 < (long)(ulong)state->have) {
        local_28 = (uint)lStack_20;
      }
      else {
        local_28 = state->have;
      }
      state->have = state->have - local_28;
      state->next = state->next + local_28;
      state->pos = (ulong)local_28 + state->pos;
      lStack_20 = lStack_20 - (ulong)local_28;
    }
    if ((state->eof != 0) && ((state->strm).avail_in == 0)) break;
    iVar1 = gz_make(state);
    if (iVar1 == -1) {
      return -1;
    }
  }
  return 0;
}

Assistant:

local int gz_skip(gz_statep state, z_off64_t len)
{
    unsigned n;

    /* skip over len bytes or reach end-of-file, whichever comes first */
    while (len)
        /* skip over whatever is in output buffer */
        if (state->have) {
            n = GT_OFF(state->have) || (z_off64_t)state->have > len ?
                (unsigned)len : state->have;
            state->have -= n;
            state->next += n;
            state->pos += n;
            len -= n;
        }

        /* output buffer empty -- return if we're at the end of the input */
        else if (state->eof && state->strm.avail_in == 0)
            break;

        /* need more data to skip -- load up output buffer */
        else {
            /* get more output, looking for header if required */
            if (gz_make(state) == -1)
                return -1;
        }
    return 0;
}